

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
RemoveLast<google::protobuf::RepeatedPtrField<google::protobuf::Message>::TypeHandler>
          (RepeatedPtrFieldBase *this)

{
  int iVar1;
  LogMessage *other;
  LogFinisher local_49;
  LogMessage local_48;
  
  iVar1 = this->current_size_;
  if (iVar1 < 1) {
    LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ff);
    other = LogMessage::operator<<(&local_48,"CHECK failed: (current_size_) > (0): ");
    LogFinisher::operator=(&local_49,other);
    LogMessage::~LogMessage(&local_48);
    iVar1 = this->current_size_;
  }
  this->current_size_ = iVar1 + -1;
  (**(code **)(*this->rep_->elements[(long)iVar1 + -1] + 0x38))();
  return;
}

Assistant:

inline void RepeatedPtrFieldBase::RemoveLast() {
  GOOGLE_DCHECK_GT(current_size_, 0);
  TypeHandler::Clear(cast<TypeHandler>(rep_->elements[--current_size_]));
}